

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O2

void decode_nvrm_ioctl_host_unmap(nvrm_ioctl_host_unmap *s)

{
  uint uVar1;
  uint32_t status;
  uint64_t uVar2;
  FILE *__stream;
  int iVar3;
  char *pcVar4;
  
  uVar1 = s->cid;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("cid");
    if (iVar3 != 0) goto LAB_00257071;
  }
  else {
LAB_00257071:
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar1 = s->handle;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("handle");
    if (iVar3 != 0) goto LAB_002570b7;
  }
  else {
LAB_002570b7:
    fprintf(_stdout,"%shandle: 0x%08x",pcVar4,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  uVar1 = s->subdev;
  if (uVar1 == 0) {
    iVar3 = _nvrm_field_enabled("subdev");
    if (iVar3 != 0) goto LAB_0025710a;
  }
  else {
LAB_0025710a:
    fprintf(_stdout,"%ssubdev: 0x%08x",nvrm_pfx,(ulong)uVar1);
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->subdev,"subdev");
  }
  if (s->_pad != 0) {
    fprintf(_stdout,"%s%s_pad: 0x%08x%s",nvrm_pfx,colors->err,(ulong)s->_pad,colors->reset);
  }
  pcVar4 = nvrm_sep;
  nvrm_pfx = nvrm_sep;
  uVar2 = s->foffset;
  if (uVar2 == 0) {
    iVar3 = _nvrm_field_enabled("foffset");
    if (iVar3 != 0) goto LAB_002571aa;
  }
  else {
LAB_002571aa:
    fprintf(_stdout,"%sfoffset: 0x%016lx",pcVar4,uVar2);
    pcVar4 = nvrm_sep;
  }
  status = s->status;
  nvrm_pfx = pcVar4;
  if (status == 0) {
    iVar3 = _nvrm_field_enabled("status");
    if (iVar3 == 0) goto LAB_00257220;
  }
  __stream = _stdout;
  nvrm_status(status);
  fprintf(__stream,"%sstatus: %s",pcVar4,nvrm_status::buf);
  pcVar4 = nvrm_sep;
LAB_00257220:
  nvrm_pfx = pcVar4;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",pcVar4,colors->err,(ulong)s->_pad2,colors->reset);
    nvrm_pfx = nvrm_sep;
  }
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_host_unmap(struct nvrm_ioctl_host_unmap *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, subdev, cid);
	nvrm_print_pad_x32(s, _pad);
	nvrm_print_x64(s, foffset);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_ln();
}